

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

QAbstractItemViewPrivate * __thiscall
QAbstractItemViewPrivate::renderToPixmap
          (QAbstractItemViewPrivate *this,QModelIndexList *indexes,QRect *r)

{
  undefined1 *puVar1;
  QModelIndex *pQVar2;
  undefined4 uVar3;
  uint uVar4;
  QWindow *pQVar5;
  long *plVar6;
  int *in_RCX;
  long lVar7;
  ulong uVar8;
  undefined1 *puVar9;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double dVar10;
  double dVar11;
  double dVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  QPainter painter;
  undefined1 *local_130;
  QArrayData *local_128;
  undefined1 *puStack_120;
  undefined1 *local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (indexes->d).ptr;
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  local_128 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
  (*(code *)(indexes->d).d[0x12].super_QArrayData.alloc)(&local_128);
  if (local_118 == (undefined1 *)0x0) {
    QPixmap::QPixmap((QPixmap *)this);
  }
  else {
    pQVar5 = QWidgetPrivate::windowHandle((QWidgetPrivate *)indexes,Closest);
    if (pQVar5 == (QWindow *)0x0) {
      dVar10 = 1.0;
      uVar3 = 0;
    }
    else {
      uVar3 = QWindow::devicePixelRatio();
      dVar10 = extraout_XMM0_Qa;
    }
    *(undefined1 **)
     &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x10 =
         &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)
     &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate =
         &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)
     &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
         &DAT_aaaaaaaaaaaaaaaa;
    dVar11 = dVar10 * (double)(((int)*(undefined8 *)(in_RCX + 2) - (int)*(undefined8 *)in_RCX) + 1);
    dVar13 = dVar10 * (double)(((int)((ulong)*(undefined8 *)(in_RCX + 2) >> 0x20) -
                               (int)((ulong)*(undefined8 *)in_RCX >> 0x20)) + 1);
    auVar12._0_8_ = (double)((ulong)dVar11 & 0x8000000000000000 | 0x3fe0000000000000) + dVar11;
    auVar12._8_8_ = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
    auVar12 = minpd(_DAT_0066f5d0,auVar12);
    auVar14._8_8_ = -(ulong)(-2147483648.0 < auVar12._8_8_);
    auVar14._0_8_ = -(ulong)(-2147483648.0 < auVar12._0_8_);
    uVar4 = movmskpd(uVar3,auVar14);
    uVar8 = 0x8000000000000000;
    if ((uVar4 & 2) != 0) {
      uVar8 = (ulong)(uint)(int)auVar12._8_8_ << 0x20;
    }
    local_108.super_QStyleOption._0_8_ = 0x80000000;
    if ((uVar4 & 1) != 0) {
      local_108.super_QStyleOption._0_8_ = (ulong)(uint)(int)auVar12._0_8_;
    }
    local_108.super_QStyleOption._0_8_ = local_108.super_QStyleOption._0_8_ | uVar8;
    QPixmap::QPixmap((QPixmap *)this,(QSize *)&local_108);
    QPixmap::setDevicePixelRatio(dVar10);
    QColor::QColor((QColor *)&local_108,transparent);
    QPixmap::fill((QColor *)this);
    local_130 = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_130,(QPaintDevice *)this);
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    (**(code **)(*(long *)pQVar2 + 0x2f8))(pQVar2,&local_108);
    local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
         local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 0x80;
    if (local_118 != (undefined1 *)0x0) {
      lVar7 = 0x10;
      puVar9 = (undefined1 *)0x0;
      do {
        puVar1 = puStack_120 + lVar7;
        local_108.super_QStyleOption.rect.x1.m_i = *(int *)(puStack_120 + lVar7 + -0x10) - *in_RCX;
        local_108.super_QStyleOption.rect.x2.m_i = *(int *)(puStack_120 + lVar7 + -8) - *in_RCX;
        local_108.super_QStyleOption.rect.y1.m_i = *(int *)(puStack_120 + lVar7 + -0xc) - in_RCX[1];
        local_108.super_QStyleOption.rect.y2.m_i = *(int *)(puStack_120 + lVar7 + -4) - in_RCX[1];
        (**(code **)&(indexes->d).d[0x13].super_QArrayData)(indexes,&local_108,puVar1);
        plVar6 = (long *)(**(code **)(*(long *)pQVar2 + 0x208))(pQVar2,puVar1);
        (**(code **)(*plVar6 + 0x60))(plVar6,&local_130,&local_108,puVar1);
        puVar9 = puVar9 + 1;
        lVar7 = lVar7 + 0x28;
      } while (puVar9 < local_118);
    }
    QBrush::~QBrush(&local_108.backgroundBrush);
    if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_108.icon);
    QLocale::~QLocale(&local_108.locale);
    QFont::~QFont(&local_108.font);
    QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
    QPainter::~QPainter((QPainter *)&local_130);
  }
  if (local_128 != (QArrayData *)0x0) {
    LOCK();
    (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_128,0x28,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QAbstractItemViewPrivate::renderToPixmap(const QModelIndexList &indexes, QRect *r) const
{
    Q_Q(const QAbstractItemView);
    Q_ASSERT(r);
    QItemViewPaintPairs paintPairs = draggablePaintPairs(indexes, r);
    if (paintPairs.isEmpty())
        return QPixmap();

    QWindow *window = windowHandle(WindowHandleMode::Closest);
    const qreal scale = window ? window->devicePixelRatio() : qreal(1);

    QPixmap pixmap(r->size() * scale);
    pixmap.setDevicePixelRatio(scale);

    pixmap.fill(Qt::transparent);
    QPainter painter(&pixmap);
    QStyleOptionViewItem option;
    q->initViewItemOption(&option);
    option.state |= QStyle::State_Selected;
    for (int j = 0; j < paintPairs.size(); ++j) {
        option.rect = paintPairs.at(j).rect.translated(-r->topLeft());
        const QModelIndex &current = paintPairs.at(j).index;
        adjustViewOptionsForIndex(&option, current);
        q->itemDelegateForIndex(current)->paint(&painter, option, current);
    }
    return pixmap;
}